

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

int __thiscall
soplex::CLUFactor<double>::updateRow
          (CLUFactor<double> *this,int r,int lv,int prow,int pcol,double pval,double eps)

{
  value_type vVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  reference pvVar8;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  double in_XMM0_Qa;
  double dVar9;
  double dVar10;
  int n;
  int m;
  int ll;
  int k;
  int j;
  int i;
  int c;
  double lx;
  double x;
  int fill;
  double in_stack_ffffffffffffff68;
  double in_stack_ffffffffffffff70;
  double dVar11;
  CLUFactor<double> *this_00;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_2c;
  
  iVar7 = *(int *)(*(long *)(in_RDI + 0x140) + (long)in_ESI * 4);
  local_58 = *(int *)(*(long *)(in_RDI + 0x148) + (long)in_ESI * 4) + -1;
  *(int *)(*(long *)(in_RDI + 0x148) + (long)in_ESI * 4) = local_58;
  local_58 = local_58 + iVar7;
  local_4c = local_58;
  while (*(int *)(*(long *)(in_RDI + 0x138) + (long)local_4c * 4) != in_R8D) {
    local_4c = local_4c + -1;
  }
  pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x120),(long)local_4c);
  dVar9 = *pvVar8 / in_XMM0_Qa;
  dVar11 = dVar9;
  pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x60),(long)in_EDX);
  *pvVar8 = dVar11;
  *(int *)(*(long *)(in_RDI + 0x78) + (long)in_EDX * 4) = in_ESI;
  *(undefined4 *)(*(long *)(in_RDI + 0x138) + (long)local_4c * 4) =
       *(undefined4 *)(*(long *)(in_RDI + 0x138) + (long)local_58 * 4);
  pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x120),(long)local_58);
  this_00 = (CLUFactor<double> *)*pvVar8;
  pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x120),(long)local_4c);
  *pvVar8 = (value_type)this_00;
  local_2c = *(int *)(*(long *)(in_RDI + 0x148) + (long)in_ECX * 4);
  local_4c = local_58;
  while (local_4c = local_4c + -1, iVar7 <= local_4c) {
    iVar2 = *(int *)(*(long *)(in_RDI + 0x138) + (long)local_4c * 4);
    if (*(int *)(*(long *)(in_RDI + 0x1e0) + (long)iVar2 * 4) != 0) {
      *(undefined4 *)(*(long *)(in_RDI + 0x1e0) + (long)iVar2 * 4) = 0;
      local_2c = local_2c + -1;
      dVar10 = *(double *)(*(long *)(in_RDI + 0x1b8) + (long)iVar2 * 8);
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x120),(long)local_4c
                         );
      *pvVar8 = *pvVar8 - dVar10 * dVar9;
      bVar5 = isZero<double,double>(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      if (bVar5) {
        *(int *)(*(long *)(in_RDI + 0x148) + (long)in_ESI * 4) =
             *(int *)(*(long *)(in_RDI + 0x148) + (long)in_ESI * 4) + -1;
        local_58 = local_58 + -1;
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x120),
                            (long)local_58);
        vVar1 = *pvVar8;
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x120),
                            (long)local_4c);
        *pvVar8 = vVar1;
        *(undefined4 *)(*(long *)(in_RDI + 0x138) + (long)local_4c * 4) =
             *(undefined4 *)(*(long *)(in_RDI + 0x138) + (long)local_58 * 4);
        *(int *)(*(long *)(in_RDI + 0x200) + (long)iVar2 * 4) =
             *(int *)(*(long *)(in_RDI + 0x200) + (long)iVar2 * 4) + -1;
        iVar6 = *(int *)(*(long *)(in_RDI + 0x1a8) + (long)iVar2 * 4) + -1;
        *(int *)(*(long *)(in_RDI + 0x1a8) + (long)iVar2 * 4) = iVar6;
        iVar6 = iVar6 + *(int *)(*(long *)(in_RDI + 0x1a0) + (long)iVar2 * 4);
        local_48 = iVar6;
        while (*(int *)(*(long *)(in_RDI + 0x180) + (long)local_48 * 4) != in_ESI) {
          local_48 = local_48 + -1;
        }
        *(undefined4 *)(*(long *)(in_RDI + 0x180) + (long)local_48 * 4) =
             *(undefined4 *)(*(long *)(in_RDI + 0x180) + (long)iVar6 * 4);
      }
    }
  }
  local_54 = *(int *)(*(long *)(in_RDI + 0x148) + (long)in_ESI * 4);
  if (*(int *)(*(long *)(in_RDI + 0x150) + (long)in_ESI * 4) < local_54 + local_2c) {
    remaxRow((CLUFactor<double> *)CONCAT44(iVar7,in_stack_ffffffffffffffa0),
             (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  }
  local_54 = *(int *)(*(long *)(in_RDI + 0x140) + (long)in_ESI * 4) + local_54;
  local_4c = *(int *)(*(long *)(in_RDI + 0x140) + (long)in_ECX * 4);
  iVar7 = local_4c + *(int *)(*(long *)(in_RDI + 0x148) + (long)in_ECX * 4);
  for (; local_4c < iVar7; local_4c = local_4c + 1) {
    iVar2 = *(int *)(*(long *)(in_RDI + 0x138) + (long)local_4c * 4);
    if (*(int *)(*(long *)(in_RDI + 0x1e0) + (long)iVar2 * 4) == 0) {
      *(undefined4 *)(*(long *)(in_RDI + 0x1e0) + (long)iVar2 * 4) = 1;
    }
    else {
      dVar10 = -*(double *)(*(long *)(in_RDI + 0x1b8) + (long)iVar2 * 8) * dVar9;
      bVar5 = isNotZero<double,double>(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      if (bVar5) {
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x120),
                            (long)local_54);
        *pvVar8 = dVar10;
        *(int *)(*(long *)(in_RDI + 0x138) + (long)local_54 * 4) = iVar2;
        local_54 = local_54 + 1;
        *(int *)(*(long *)(in_RDI + 0x148) + (long)in_ESI * 4) =
             *(int *)(*(long *)(in_RDI + 0x148) + (long)in_ESI * 4) + 1;
        if (*(int *)(*(long *)(in_RDI + 0x1b0) + (long)iVar2 * 4) <=
            *(int *)(*(long *)(in_RDI + 0x1a8) + (long)iVar2 * 4)) {
          remaxCol(this_00,(int)((ulong)dVar11 >> 0x20),SUB84(dVar11,0));
        }
        lVar4 = *(long *)(in_RDI + 0x180);
        iVar6 = *(int *)(*(long *)(in_RDI + 0x1a0) + (long)iVar2 * 4);
        iVar3 = *(int *)(*(long *)(in_RDI + 0x1a8) + (long)iVar2 * 4);
        *(int *)(*(long *)(in_RDI + 0x1a8) + (long)iVar2 * 4) = iVar3 + 1;
        *(int *)(lVar4 + (long)(iVar6 + iVar3) * 4) = in_ESI;
        *(int *)(*(long *)(in_RDI + 0x200) + (long)iVar2 * 4) =
             *(int *)(*(long *)(in_RDI + 0x200) + (long)iVar2 * 4) + 1;
        in_stack_ffffffffffffff70 = dVar10;
      }
    }
  }
  *(undefined8 *)(*(long *)(*(long *)(in_RDI + 0x240) + (long)in_ESI * 0x20) + 8) =
       *(undefined8 *)(*(long *)(in_RDI + 0x240) + (long)in_ESI * 0x20 + 8);
  **(undefined8 **)(*(long *)(in_RDI + 0x240) + (long)in_ESI * 0x20 + 8) =
       *(undefined8 *)(*(long *)(in_RDI + 0x240) + (long)in_ESI * 0x20);
  *(undefined8 *)(*(long *)(in_RDI + 0x240) + (long)in_ESI * 0x20) =
       *(undefined8 *)
        (*(long *)(in_RDI + 0x248) +
        (long)*(int *)(*(long *)(in_RDI + 0x148) + (long)in_ESI * 4) * 0x20);
  *(long *)(*(long *)(*(long *)(in_RDI + 0x240) + (long)in_ESI * 0x20) + 8) =
       *(long *)(in_RDI + 0x240) + (long)in_ESI * 0x20;
  *(long *)(*(long *)(in_RDI + 0x240) + (long)in_ESI * 0x20 + 8) =
       *(long *)(in_RDI + 0x248) +
       (long)*(int *)(*(long *)(in_RDI + 0x148) + (long)in_ESI * 4) * 0x20;
  *(long *)(*(long *)(in_RDI + 0x248) +
           (long)*(int *)(*(long *)(in_RDI + 0x148) + (long)in_ESI * 4) * 0x20) =
       *(long *)(in_RDI + 0x240) + (long)in_ESI * 0x20;
  pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1e8),(long)in_ESI);
  *pvVar8 = -1.0;
  return in_EDX + 1;
}

Assistant:

int CLUFactor<R>::updateRow(int r,
                            int lv,
                            int prow,
                            int pcol,
                            R pval,
                            R eps)
{
   int fill;
   R x, lx;
   int c, i, j, k, ll, m, n;

   n = u.row.start[r];
   m = --(u.row.len[r]) + n;

   /*  compute L VectorBase<R> entry and
    *  and remove pivot column form row file
    */

   for(j = m; u.row.idx[j] != pcol; --j)
      ;

   lx = u.row.val[j] / pval;

   l.val[lv] = lx;

   l.idx[lv] = r;

   ++lv;

   u.row.idx[j] = u.row.idx[m];

   u.row.val[j] = u.row.val[m];


   /*  update loop (I) and
    *  computing expected fill
    */
   fill = u.row.len[prow];

   for(j = m - 1; j >= n; --j)
   {
      c = u.row.idx[j];

      if(temp.s_mark[c])
      {
         /*  count fill elements.
          */
         temp.s_mark[c] = 0;
         --fill;

         /*  update row values
          */
         x = u.row.val[j] -= work[c] * lx;

         if(isZero(x, eps))
         {
            /* Eliminate zero from row r
             */
            --u.row.len[r];
            --m;
            u.row.val[j] = u.row.val[m];
            u.row.idx[j] = u.row.idx[m];

            /* Eliminate zero from column c
             */
            --(temp.s_cact[c]);
            k = --(u.col.len[c]) + u.col.start[c];

            for(i = k; u.col.idx[i] != r; --i)
               ;

            u.col.idx[i] = u.col.idx[k];
         }
      }
   }


   /*  create space for fill in row file
    */
   ll = u.row.len[r];

   if(ll + fill > u.row.max[r])
      remaxRow(r, ll + fill);

   ll += u.row.start[r];

   /*  fill creating update loop (II)
    */
   for(j = u.row.start[prow], m = j + u.row.len[prow]; j < m; ++j)
   {
      c = u.row.idx[j];

      if(temp.s_mark[c])
      {
         x = - work[c] * lx;

         if(isNotZero(x, eps))
         {
            /* produce fill element in row r
             */
            u.row.val[ll] = x;
            u.row.idx[ll] = c;
            ll++;
            u.row.len[r]++;

            /* produce fill element in column c
             */

            if(u.col.len[c] >= u.col.max[c])
               remaxCol(c, u.col.len[c] + 1);

            u.col.idx[u.col.start[c] + (u.col.len[c])++] = r;

            temp.s_cact[c]++;
         }
      }
      else
         temp.s_mark[c] = 1;
   }

   /*  move row to appropriate list.
    */
   removeDR(temp.pivot_row[r]);

   init2DR(temp.pivot_row[r], temp.pivot_rowNZ[u.row.len[r]]);

   assert(row.perm[r] < 0);

   temp.s_max[r] = -1;

   return lv;
}